

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLRNLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  LRNLayerParams *this_00;
  string *__rhs;
  float fVar3;
  undefined1 local_198 [72];
  undefined1 local_150 [8];
  string err;
  Result local_108;
  undefined1 local_d8 [32];
  Result local_b8;
  Result local_88;
  Result local_50;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_50.m_message._M_storage._M_storage[7] = '\0';
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  validateInputCount((Result_conflict *)&local_50,local_20,1,1);
  Result::operator=((Result *)__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result_conflict *)&local_88,local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good((Result *)__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    local_50.m_message._M_storage._M_storage[7] = 1;
    local_b8.m_message._M_storage._M_storage[4] = '\x01';
    local_b8.m_message._M_storage._M_storage[5] = '\0';
    local_b8.m_message._M_storage._M_storage[6] = '\0';
    local_b8.m_message._M_storage._M_storage[7] = '\0';
    goto LAB_003fd547;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,"LRNLayer",
               (allocator *)((long)local_108.m_message._M_storage._M_storage + 7));
    validateInputOutputRankEquality
              ((Result_conflict *)(local_d8 + 0x20),pNVar1,(string *)local_d8,&this->blobNameToRank)
    ;
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_d8 + 0x20));
    Result::~Result((Result *)(local_d8 + 0x20));
    std::__cxx11::string::~string((string *)local_d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)local_108.m_message._M_storage._M_storage + 7));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_b8.m_message._M_storage._M_storage[4] = '\x01';
      local_b8.m_message._M_storage._M_storage[5] = '\0';
      local_b8.m_message._M_storage._M_storage[6] = '\0';
      local_b8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_003fd547;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&err._M_storage,"LRNLayer",
               (allocator *)((long)&err.super__Rb_tree_node_base._M_right + 7));
    validateRankCount((Result_conflict *)&local_108,pNVar1,(string *)&err._M_storage,3,-1,
                      &this->blobNameToRank);
    Result::operator=((Result *)__return_storage_ptr__,&local_108);
    Result::~Result(&local_108);
    std::__cxx11::string::~string((string *)&err._M_storage);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&err.super__Rb_tree_node_base._M_right + 7));
    bVar2 = Result::good((Result *)__return_storage_ptr__);
    if (!bVar2) {
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_b8.m_message._M_storage._M_storage[4] = '\x01';
      local_b8.m_message._M_storage._M_storage[5] = '\0';
      local_b8.m_message._M_storage._M_storage[6] = '\0';
      local_b8.m_message._M_storage._M_storage[7] = '\0';
      goto LAB_003fd547;
    }
  }
  this_00 = Specification::NeuralNetworkLayer::lrn(local_20);
  fVar3 = Specification::LRNLayerParams::k(this_00);
  if (0.0 <= fVar3) {
    local_50.m_message._M_storage._M_storage[7] = 1;
    local_b8.m_message._M_storage._M_storage[4] = '\x01';
    local_b8.m_message._M_storage._M_storage[5] = '\0';
    local_b8.m_message._M_storage._M_storage[6] = '\0';
    local_b8.m_message._M_storage._M_storage[7] = '\0';
  }
  else {
    __rhs = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x28),"Parameter \'K\' for the LRN layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_198 + 0x28),"\' must be positive.");
    std::__cxx11::string::~string((string *)(local_198 + 0x28));
    Result::Result((Result *)local_198,INVALID_MODEL_PARAMETERS,(string *)local_150);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)local_198);
    Result::~Result((Result *)local_198);
    local_50.m_message._M_storage._M_storage[7] = 1;
    local_b8.m_message._M_storage._M_storage[4] = '\x01';
    local_b8.m_message._M_storage._M_storage[5] = '\0';
    local_b8.m_message._M_storage._M_storage[6] = '\0';
    local_b8.m_message._M_storage._M_storage[7] = '\0';
    std::__cxx11::string::~string((string *)local_150);
  }
LAB_003fd547:
  if ((local_50.m_message._M_storage._M_storage[7] & 1) == 0) {
    Result::~Result((Result *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLRNLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "LRNLayer", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "LRNLayer", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    if (layer.lrn().k() < 0.0) {
        std::string err = "Parameter 'K' for the LRN layer '" + layer.name() + "' must be positive.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}